

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O3

void __thiscall
PartsBupOutputter::newMouth
          (PartsBupOutputter *this,Image *img,Point pos,int num,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  uint uVar5;
  Blend BVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  uint __val;
  undefined8 uVar10;
  uint __len;
  bool bVar11;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  path local_a8;
  path local_80;
  Image *local_58;
  string local_50;
  
  bVar11 = (this->withFaceName)._M_string_length != 0;
  local_a8._M_pathname._M_dataplus._M_p = (pointer)&local_a8._M_pathname.field_2;
  pcVar4 = (&this->baseName)[bVar11]._M_dataplus._M_p;
  local_58 = img;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar4,pcVar4 + (&this->baseName)[bVar11]._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  __val = -num;
  if (0 < num) {
    __val = num;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar8 = (uint)uVar9;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_0010fbef;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_0010fbef;
      }
      if (uVar8 < 10000) goto LAB_0010fbef;
      uVar9 = uVar9 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_0010fbef:
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_c8,(char)__len - (char)(num >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_c8._M_dataplus._M_p + ((uint)num >> 0x1f),__len,__val);
  paVar2 = &local_a8._M_pathname.field_2;
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != paVar2) {
    uVar10 = local_a8._M_pathname.field_2._M_allocated_capacity;
  }
  paVar3 = &local_c8.field_2;
  if ((ulong)uVar10 < local_c8._M_string_length + local_a8._M_pathname._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar3) {
      uVar10 = local_c8.field_2._M_allocated_capacity;
    }
    if (local_c8._M_string_length + local_a8._M_pathname._M_string_length <= (ulong)uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_c8,0,(char *)0x0,
                          (ulong)local_a8._M_pathname._M_dataplus._M_p);
      goto LAB_0010fc7f;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
LAB_0010fc7f:
  local_80._M_pathname._M_dataplus._M_p = (pointer)&local_80._M_pathname.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_80._M_pathname.field_2._M_allocated_capacity = *psVar1;
    local_80._M_pathname.field_2._8_8_ = puVar7[3];
  }
  else {
    local_80._M_pathname.field_2._M_allocated_capacity = *psVar1;
    local_80._M_pathname._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_80._M_pathname._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->withMouthName,(string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_pathname._M_dataplus._M_p != &local_80._M_pathname.field_2) {
    operator_delete(local_80._M_pathname._M_dataplus._M_p,
                    local_80._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  this->mouthPos = pos;
  BVar6 = prepareImageInTmp(this,local_58,pos,mask,&this->withFace);
  this->mouthBlend = BVar6;
  pcVar4 = (this->withMouthName)._M_dataplus._M_p;
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar4,pcVar4 + (this->withMouthName)._M_string_length);
  std::__cxx11::string::append((char *)&local_c8);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_a8,&local_c8,auto_format);
  std::filesystem::__cxx11::operator/(&local_80,&this->partsPath,&local_a8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  Image::writePNG(&this->tmp,&local_80,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_80);
  std::filesystem::__cxx11::path::~path(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void newMouth(const Image& img, Point pos, int num, const std::vector<MaskRect>& mask) override {
		withMouthName = (withFaceName.empty() ? baseName : withFaceName) + "_" + std::to_string(num);
		mouthPos = pos;
		mouthBlend = prepareImageInTmp(img, pos, mask, withFace);
		tmp.writePNG(partsPath/fs::u8path(withMouthName + ".png"));
	}